

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O1

void ncnn::convdw3x3s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  size_t sVar16;
  size_t sVar17;
  void *pvVar18;
  size_t sVar19;
  size_t sVar20;
  long lVar21;
  int iVar22;
  float *pfVar23;
  int iVar24;
  int iVar25;
  float *pfVar26;
  long lVar27;
  float *pfVar28;
  float *pfVar29;
  float fVar30;
  
  iVar9 = bottom_blob->c;
  if (0 < (long)iVar9) {
    iVar10 = top_blob->w;
    iVar11 = top_blob->h;
    pvVar13 = _kernel->data;
    pvVar14 = _bias->data;
    iVar12 = bottom_blob->w;
    iVar22 = (iVar12 - iVar10) * 2;
    pvVar15 = top_blob->data;
    sVar16 = top_blob->cstep;
    sVar17 = top_blob->elemsize;
    pvVar18 = bottom_blob->data;
    sVar19 = bottom_blob->cstep;
    sVar20 = bottom_blob->elemsize;
    lVar27 = 0;
    do {
      if (pvVar14 == (void *)0x0) {
        fVar30 = 0.0;
      }
      else {
        fVar30 = *(float *)((long)pvVar14 + lVar27 * 4);
      }
      if (0 < iVar11) {
        pfVar23 = (float *)(sVar16 * sVar17 * lVar27 + (long)pvVar15);
        lVar21 = lVar27 * 0x24;
        pfVar26 = (float *)(sVar19 * sVar20 * lVar27 + (long)pvVar18);
        pfVar28 = pfVar26 + (long)iVar12 * 2;
        pfVar29 = pfVar26 + iVar12;
        iVar24 = 0;
        do {
          iVar25 = iVar10 + 1;
          if (0 < iVar10) {
            do {
              pfVar4 = pfVar26 + 1;
              fVar6 = *pfVar26;
              pfVar26 = pfVar26 + 2;
              fVar7 = *pfVar29;
              pfVar1 = pfVar29 + 1;
              pfVar29 = pfVar29 + 2;
              pfVar3 = (float *)((long)pvVar13 + lVar21);
              pfVar5 = (float *)((long)pvVar13 + lVar21 + 0x10);
              uVar8 = *(undefined8 *)pfVar28;
              pfVar2 = pfVar28 + 2;
              pfVar28 = pfVar28 + 2;
              *pfVar23 = (float)((ulong)uVar8 >> 0x20) * pfVar5[3] + fVar7 * pfVar3[3] +
                         (float)((ulong)*(undefined8 *)pfVar1 >> 0x20) * pfVar5[1] +
                         (float)*(undefined8 *)pfVar4 * pfVar3[1] +
                         (float)uVar8 * pfVar5[2] +
                         (float)((ulong)*(undefined8 *)pfVar4 >> 0x20) * pfVar3[2] +
                         (float)*(undefined8 *)pfVar1 * *pfVar5 + fVar6 * *pfVar3 +
                         *(float *)((long)pvVar13 + lVar21 + 0x20) * *pfVar2 + fVar30;
              pfVar23 = pfVar23 + 1;
              iVar25 = iVar25 + -1;
            } while (1 < iVar25);
          }
          pfVar26 = pfVar26 + iVar22;
          pfVar29 = pfVar29 + iVar22;
          pfVar28 = pfVar28 + iVar22;
          iVar24 = iVar24 + 1;
        } while (iVar24 != iVar11);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != iVar9);
  }
  return;
}

Assistant:

static void convdw3x3s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = w - 2*outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g=0; g<group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g*9;

        float* outptr = out;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w*2;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain>0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }

    }
}